

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_loongson_integer(DisasContext_conflict6 *ctx,uint32_t opc,int rd,int rs,int rt)

{
  uint uVar1;
  TCGContext_conflict6 *s;
  _Bool temp_local;
  TCGTemp *a1;
  TCGTemp *a1_00;
  TCGLabel *pTVar2;
  TCGLabel *pTVar3;
  TCGLabel *a1_01;
  TCGv_i64 pTVar4;
  TCGv_i64 pTVar5;
  uintptr_t o_4;
  TCGOpcode TVar6;
  uintptr_t o_5;
  TCGv_i64 arg1;
  
  if (rd == 0) {
    return;
  }
  s = ctx->uc->tcg_ctx;
  temp_local = false;
  uVar1 = opc + 0x8ffffff0;
  if ((3 < uVar1) && ((5 < opc + 0x83ffffe8 || ((0x33U >> (opc + 0x83ffffe8 & 0x1f) & 1) == 0)))) {
    temp_local = true;
  }
  a1 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,temp_local);
  arg1 = (TCGv_i64)((long)a1 - (long)s);
  a1_00 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,temp_local);
  if (rs == 0) {
    TVar6 = INDEX_op_movi_i64;
    pTVar4 = (TCGv_i64)0x0;
LAB_009b8fd6:
    tcg_gen_op2_mips64el(s,TVar6,(TCGArg)a1,(TCGArg)pTVar4);
  }
  else if (s->cpu_gpr[rs] != arg1) {
    pTVar4 = s->cpu_gpr[rs] + (long)s;
    TVar6 = INDEX_op_mov_i64;
    goto LAB_009b8fd6;
  }
  pTVar4 = (TCGv_i64)((long)a1_00 - (long)s);
  if (rt == 0) {
    TVar6 = INDEX_op_movi_i64;
    pTVar5 = (TCGv_i64)0x0;
LAB_009b9018:
    tcg_gen_op2_mips64el(s,TVar6,(TCGArg)a1_00,(TCGArg)pTVar5);
  }
  else if (s->cpu_gpr[rt] != pTVar4) {
    pTVar5 = s->cpu_gpr[rt] + (long)s;
    TVar6 = INDEX_op_mov_i64;
    goto LAB_009b9018;
  }
  if (uVar1 < 0x10) {
    (*(code *)(&DAT_00da9d20 + *(int *)(&DAT_00da9d20 + (ulong)uVar1 * 4)))();
    return;
  }
  switch(opc) {
  case 0x7c000018:
    pTVar5 = s->cpu_gpr[(uint)rd];
    goto LAB_009b959f;
  case 0x7c000019:
    tcg_gen_ext32u_i64_mips64el(s,arg1,arg1);
    tcg_gen_ext32u_i64_mips64el(s,pTVar4,pTVar4);
    pTVar5 = s->cpu_gpr[(uint)rd];
LAB_009b959f:
    tcg_gen_op3_mips64el
              (s,INDEX_op_mul_i64,(TCGArg)((long)&s->pool_cur + (long)pTVar5),(TCGArg)a1,
               (TCGArg)a1_00);
    tcg_gen_ext32s_i64_mips64el(s,s->cpu_gpr[(uint)rd],s->cpu_gpr[(uint)rd]);
    goto switchD_009b9062_caseD_7c000020;
  case 0x7c00001a:
    pTVar3 = gen_new_label_mips64el(s);
    pTVar2 = gen_new_label_mips64el(s);
    a1_01 = gen_new_label_mips64el(s);
    tcg_gen_ext32s_i64_mips64el(s,arg1,arg1);
    tcg_gen_ext32s_i64_mips64el(s,pTVar4,pTVar4);
    tcg_gen_brcondi_i64_mips64el(s,TCG_COND_NE,pTVar4,0,pTVar3);
    tcg_gen_op2_mips64el
              (s,INDEX_op_movi_i64,(TCGArg)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)rd]),0);
    *(short *)&a1_01->field_0x2 =
         (short)((uint)*(ushort *)&a1_01->field_0x2 * 0x10000 + 0x10000 >> 0x10);
    tcg_gen_op1_mips64el(s,INDEX_op_br,(TCGArg)a1_01);
    *(byte *)pTVar3 = *(byte *)pTVar3 | 1;
    tcg_gen_op1_mips64el(s,INDEX_op_set_label,(TCGArg)pTVar3);
    tcg_gen_brcondi_i64_mips64el(s,TCG_COND_NE,arg1,-0x80000000,pTVar2);
    tcg_gen_brcondi_i64_mips64el(s,TCG_COND_NE,pTVar4,-1,pTVar2);
    if (s->cpu_gpr[(uint)rd] != arg1) {
      tcg_gen_op2_mips64el(s,INDEX_op_mov_i64,(TCGArg)(s->cpu_gpr[(uint)rd] + (long)s),(TCGArg)a1);
    }
    *(short *)&a1_01->field_0x2 =
         (short)((uint)*(ushort *)&a1_01->field_0x2 * 0x10000 + 0x10000 >> 0x10);
    tcg_gen_op1_mips64el(s,INDEX_op_br,(TCGArg)a1_01);
    *(byte *)pTVar2 = *(byte *)pTVar2 | 1;
    tcg_gen_op1_mips64el(s,INDEX_op_set_label,(TCGArg)pTVar2);
    tcg_gen_div_i64_mips64el(s,s->cpu_gpr[(uint)rd],arg1,pTVar4);
    tcg_gen_ext32s_i64_mips64el(s,s->cpu_gpr[(uint)rd],s->cpu_gpr[(uint)rd]);
    *(byte *)a1_01 = *(byte *)a1_01 | 1;
    goto LAB_009b98e4;
  case 0x7c00001b:
    pTVar3 = gen_new_label_mips64el(s);
    a1_01 = gen_new_label_mips64el(s);
    tcg_gen_ext32u_i64_mips64el(s,arg1,arg1);
    tcg_gen_ext32u_i64_mips64el(s,pTVar4,pTVar4);
    tcg_gen_brcondi_i64_mips64el(s,TCG_COND_NE,pTVar4,0,pTVar3);
    tcg_gen_op2_mips64el
              (s,INDEX_op_movi_i64,(TCGArg)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)rd]),0);
    *(short *)&a1_01->field_0x2 =
         (short)((uint)*(ushort *)&a1_01->field_0x2 * 0x10000 + 0x10000 >> 0x10);
    tcg_gen_op1_mips64el(s,INDEX_op_br,(TCGArg)a1_01);
    *(byte *)pTVar3 = *(byte *)pTVar3 | 1;
    tcg_gen_op1_mips64el(s,INDEX_op_set_label,(TCGArg)pTVar3);
    tcg_gen_divu_i64_mips64el(s,s->cpu_gpr[(uint)rd],arg1,pTVar4);
    goto LAB_009b9823;
  case 0x7c00001c:
  case 0x7c00001d:
    tcg_gen_op3_mips64el
              (s,INDEX_op_mul_i64,(TCGArg)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)rd]),
               (TCGArg)a1,(TCGArg)a1_00);
    goto switchD_009b9062_caseD_7c000020;
  case 0x7c00001e:
    pTVar3 = gen_new_label_mips64el(s);
    pTVar2 = gen_new_label_mips64el(s);
    a1_01 = gen_new_label_mips64el(s);
    tcg_gen_brcondi_i64_mips64el(s,TCG_COND_NE,pTVar4,0,pTVar3);
    tcg_gen_op2_mips64el
              (s,INDEX_op_movi_i64,(TCGArg)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)rd]),0);
    *(short *)&a1_01->field_0x2 =
         (short)((uint)*(ushort *)&a1_01->field_0x2 * 0x10000 + 0x10000 >> 0x10);
    tcg_gen_op1_mips64el(s,INDEX_op_br,(TCGArg)a1_01);
    *(byte *)pTVar3 = *(byte *)pTVar3 | 1;
    tcg_gen_op1_mips64el(s,INDEX_op_set_label,(TCGArg)pTVar3);
    tcg_gen_brcondi_i64_mips64el(s,TCG_COND_NE,arg1,-0x8000000000000000,pTVar2);
    tcg_gen_brcondi_i64_mips64el(s,TCG_COND_NE,pTVar4,-1,pTVar2);
    if (s->cpu_gpr[(uint)rd] != arg1) {
      tcg_gen_op2_mips64el(s,INDEX_op_mov_i64,(TCGArg)(s->cpu_gpr[(uint)rd] + (long)s),(TCGArg)a1);
    }
    *(short *)&a1_01->field_0x2 =
         (short)((uint)*(ushort *)&a1_01->field_0x2 * 0x10000 + 0x10000 >> 0x10);
    tcg_gen_op1_mips64el(s,INDEX_op_br,(TCGArg)a1_01);
    *(byte *)pTVar2 = *(byte *)pTVar2 | 1;
    tcg_gen_op1_mips64el(s,INDEX_op_set_label,(TCGArg)pTVar2);
    tcg_gen_div_i64_mips64el(s,s->cpu_gpr[(uint)rd],arg1,pTVar4);
    break;
  case 0x7c00001f:
    pTVar3 = gen_new_label_mips64el(s);
    a1_01 = gen_new_label_mips64el(s);
    tcg_gen_brcondi_i64_mips64el(s,TCG_COND_NE,pTVar4,0,pTVar3);
    tcg_gen_op2_mips64el
              (s,INDEX_op_movi_i64,(TCGArg)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)rd]),0);
    *(short *)&a1_01->field_0x2 =
         (short)((uint)*(ushort *)&a1_01->field_0x2 * 0x10000 + 0x10000 >> 0x10);
    tcg_gen_op1_mips64el(s,INDEX_op_br,(TCGArg)a1_01);
    *(byte *)pTVar3 = *(byte *)pTVar3 | 1;
    tcg_gen_op1_mips64el(s,INDEX_op_set_label,(TCGArg)pTVar3);
    tcg_gen_divu_i64_mips64el(s,s->cpu_gpr[(uint)rd],arg1,pTVar4);
    break;
  default:
    goto switchD_009b9062_caseD_7c000020;
  case 0x7c000022:
    pTVar3 = gen_new_label_mips64el(s);
    pTVar2 = gen_new_label_mips64el(s);
    a1_01 = gen_new_label_mips64el(s);
    tcg_gen_ext32u_i64_mips64el(s,arg1,arg1);
    tcg_gen_ext32u_i64_mips64el(s,pTVar4,pTVar4);
    tcg_gen_brcondi_i64_mips64el(s,TCG_COND_EQ,pTVar4,0,pTVar3);
    tcg_gen_brcondi_i64_mips64el(s,TCG_COND_NE,arg1,-0x80000000,pTVar2);
    tcg_gen_brcondi_i64_mips64el(s,TCG_COND_NE,pTVar4,-1,pTVar2);
    *(byte *)pTVar3 = *(byte *)pTVar3 | 1;
    tcg_gen_op1_mips64el(s,INDEX_op_set_label,(TCGArg)pTVar3);
    tcg_gen_op2_mips64el
              (s,INDEX_op_movi_i64,(TCGArg)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)rd]),0);
    *(short *)&a1_01->field_0x2 =
         (short)((uint)*(ushort *)&a1_01->field_0x2 * 0x10000 + 0x10000 >> 0x10);
    tcg_gen_op1_mips64el(s,INDEX_op_br,(TCGArg)a1_01);
    *(byte *)pTVar2 = *(byte *)pTVar2 | 1;
    tcg_gen_op1_mips64el(s,INDEX_op_set_label,(TCGArg)pTVar2);
    tcg_gen_rem_i64_mips64el(s,s->cpu_gpr[(uint)rd],arg1,pTVar4);
    goto LAB_009b9823;
  case 0x7c000023:
    pTVar3 = gen_new_label_mips64el(s);
    a1_01 = gen_new_label_mips64el(s);
    tcg_gen_ext32u_i64_mips64el(s,arg1,arg1);
    tcg_gen_ext32u_i64_mips64el(s,pTVar4,pTVar4);
    tcg_gen_brcondi_i64_mips64el(s,TCG_COND_NE,pTVar4,0,pTVar3);
    tcg_gen_op2_mips64el
              (s,INDEX_op_movi_i64,(TCGArg)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)rd]),0);
    *(short *)&a1_01->field_0x2 =
         (short)((uint)*(ushort *)&a1_01->field_0x2 * 0x10000 + 0x10000 >> 0x10);
    tcg_gen_op1_mips64el(s,INDEX_op_br,(TCGArg)a1_01);
    *(byte *)pTVar3 = *(byte *)pTVar3 | 1;
    tcg_gen_op1_mips64el(s,INDEX_op_set_label,(TCGArg)pTVar3);
    tcg_gen_remu_i64_mips64el(s,s->cpu_gpr[(uint)rd],arg1,pTVar4);
LAB_009b9823:
    tcg_gen_ext32s_i64_mips64el(s,s->cpu_gpr[(uint)rd],s->cpu_gpr[(uint)rd]);
    break;
  case 0x7c000026:
    pTVar3 = gen_new_label_mips64el(s);
    pTVar2 = gen_new_label_mips64el(s);
    a1_01 = gen_new_label_mips64el(s);
    tcg_gen_brcondi_i64_mips64el(s,TCG_COND_EQ,pTVar4,0,pTVar3);
    tcg_gen_brcondi_i64_mips64el(s,TCG_COND_NE,arg1,-0x8000000000000000,pTVar2);
    tcg_gen_brcondi_i64_mips64el(s,TCG_COND_NE,pTVar4,-1,pTVar2);
    *(byte *)pTVar3 = *(byte *)pTVar3 | 1;
    tcg_gen_op1_mips64el(s,INDEX_op_set_label,(TCGArg)pTVar3);
    tcg_gen_op2_mips64el
              (s,INDEX_op_movi_i64,(TCGArg)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)rd]),0);
    *(short *)&a1_01->field_0x2 =
         (short)((uint)*(ushort *)&a1_01->field_0x2 * 0x10000 + 0x10000 >> 0x10);
    tcg_gen_op1_mips64el(s,INDEX_op_br,(TCGArg)a1_01);
    *(byte *)pTVar2 = *(byte *)pTVar2 | 1;
    tcg_gen_op1_mips64el(s,INDEX_op_set_label,(TCGArg)pTVar2);
    tcg_gen_rem_i64_mips64el(s,s->cpu_gpr[(uint)rd],arg1,pTVar4);
    break;
  case 0x7c000027:
    pTVar3 = gen_new_label_mips64el(s);
    a1_01 = gen_new_label_mips64el(s);
    tcg_gen_brcondi_i64_mips64el(s,TCG_COND_NE,pTVar4,0,pTVar3);
    tcg_gen_op2_mips64el
              (s,INDEX_op_movi_i64,(TCGArg)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)rd]),0);
    *(short *)&a1_01->field_0x2 =
         (short)((uint)*(ushort *)&a1_01->field_0x2 * 0x10000 + 0x10000 >> 0x10);
    tcg_gen_op1_mips64el(s,INDEX_op_br,(TCGArg)a1_01);
    *(byte *)pTVar3 = *(byte *)pTVar3 | 1;
    tcg_gen_op1_mips64el(s,INDEX_op_set_label,(TCGArg)pTVar3);
    tcg_gen_remu_i64_mips64el(s,s->cpu_gpr[(uint)rd],arg1,pTVar4);
  }
  *(byte *)a1_01 = *(byte *)a1_01 | 1;
LAB_009b98e4:
  tcg_gen_op1_mips64el(s,INDEX_op_set_label,(TCGArg)a1_01);
switchD_009b9062_caseD_7c000020:
  tcg_temp_free_internal_mips64el(s,(TCGTemp *)(arg1 + (long)s));
  tcg_temp_free_internal_mips64el(s,(TCGTemp *)(pTVar4 + (long)s));
  return;
}

Assistant:

static void gen_loongson_integer(DisasContext *ctx, uint32_t opc,
                                 int rd, int rs, int rt)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0, t1;

    if (rd == 0) {
        /* Treat as NOP. */
        return;
    }

    switch (opc) {
    case OPC_MULT_G_2E:
    case OPC_MULT_G_2F:
    case OPC_MULTU_G_2E:
    case OPC_MULTU_G_2F:
#if defined(TARGET_MIPS64)
    case OPC_DMULT_G_2E:
    case OPC_DMULT_G_2F:
    case OPC_DMULTU_G_2E:
    case OPC_DMULTU_G_2F:
#endif
        t0 = tcg_temp_new(tcg_ctx);
        t1 = tcg_temp_new(tcg_ctx);
        break;
    default:
        t0 = tcg_temp_local_new(tcg_ctx);
        t1 = tcg_temp_local_new(tcg_ctx);
        break;
    }

    gen_load_gpr(tcg_ctx, t0, rs);
    gen_load_gpr(tcg_ctx, t1, rt);

    switch (opc) {
    case OPC_MULT_G_2E:
    case OPC_MULT_G_2F:
        tcg_gen_mul_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0, t1);
        tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rd]);
        break;
    case OPC_MULTU_G_2E:
    case OPC_MULTU_G_2F:
        tcg_gen_ext32u_tl(tcg_ctx, t0, t0);
        tcg_gen_ext32u_tl(tcg_ctx, t1, t1);
        tcg_gen_mul_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0, t1);
        tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rd]);
        break;
    case OPC_DIV_G_2E:
    case OPC_DIV_G_2F:
        {
            TCGLabel *l1 = gen_new_label(tcg_ctx);
            TCGLabel *l2 = gen_new_label(tcg_ctx);
            TCGLabel *l3 = gen_new_label(tcg_ctx);
            tcg_gen_ext32s_tl(tcg_ctx, t0, t0);
            tcg_gen_ext32s_tl(tcg_ctx, t1, t1);
            tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_NE, t1, 0, l1);
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], 0);
            tcg_gen_br(tcg_ctx, l3);
            gen_set_label(tcg_ctx, l1);
            tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_NE, t0, INT_MIN, l2);
            tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_NE, t1, -1, l2);
            tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0);
            tcg_gen_br(tcg_ctx, l3);
            gen_set_label(tcg_ctx, l2);
            tcg_gen_div_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0, t1);
            tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rd]);
            gen_set_label(tcg_ctx, l3);
        }
        break;
    case OPC_DIVU_G_2E:
    case OPC_DIVU_G_2F:
        {
            TCGLabel *l1 = gen_new_label(tcg_ctx);
            TCGLabel *l2 = gen_new_label(tcg_ctx);
            tcg_gen_ext32u_tl(tcg_ctx, t0, t0);
            tcg_gen_ext32u_tl(tcg_ctx, t1, t1);
            tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_NE, t1, 0, l1);
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], 0);
            tcg_gen_br(tcg_ctx, l2);
            gen_set_label(tcg_ctx, l1);
            tcg_gen_divu_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0, t1);
            tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rd]);
            gen_set_label(tcg_ctx, l2);
        }
        break;
    case OPC_MOD_G_2E:
    case OPC_MOD_G_2F:
        {
            TCGLabel *l1 = gen_new_label(tcg_ctx);
            TCGLabel *l2 = gen_new_label(tcg_ctx);
            TCGLabel *l3 = gen_new_label(tcg_ctx);
            tcg_gen_ext32u_tl(tcg_ctx, t0, t0);
            tcg_gen_ext32u_tl(tcg_ctx, t1, t1);
            tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_EQ, t1, 0, l1);
            tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_NE, t0, INT_MIN, l2);
            tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_NE, t1, -1, l2);
            gen_set_label(tcg_ctx, l1);
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], 0);
            tcg_gen_br(tcg_ctx, l3);
            gen_set_label(tcg_ctx, l2);
            tcg_gen_rem_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0, t1);
            tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rd]);
            gen_set_label(tcg_ctx, l3);
        }
        break;
    case OPC_MODU_G_2E:
    case OPC_MODU_G_2F:
        {
            TCGLabel *l1 = gen_new_label(tcg_ctx);
            TCGLabel *l2 = gen_new_label(tcg_ctx);
            tcg_gen_ext32u_tl(tcg_ctx, t0, t0);
            tcg_gen_ext32u_tl(tcg_ctx, t1, t1);
            tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_NE, t1, 0, l1);
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], 0);
            tcg_gen_br(tcg_ctx, l2);
            gen_set_label(tcg_ctx, l1);
            tcg_gen_remu_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0, t1);
            tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rd]);
            gen_set_label(tcg_ctx, l2);
        }
        break;
#if defined(TARGET_MIPS64)
    case OPC_DMULT_G_2E:
    case OPC_DMULT_G_2F:
        tcg_gen_mul_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0, t1);
        break;
    case OPC_DMULTU_G_2E:
    case OPC_DMULTU_G_2F:
        tcg_gen_mul_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0, t1);
        break;
    case OPC_DDIV_G_2E:
    case OPC_DDIV_G_2F:
        {
            TCGLabel *l1 = gen_new_label(tcg_ctx);
            TCGLabel *l2 = gen_new_label(tcg_ctx);
            TCGLabel *l3 = gen_new_label(tcg_ctx);
            tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_NE, t1, 0, l1);
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], 0);
            tcg_gen_br(tcg_ctx, l3);
            gen_set_label(tcg_ctx, l1);
            tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_NE, t0, -1LL << 63, l2);
            tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_NE, t1, -1LL, l2);
            tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0);
            tcg_gen_br(tcg_ctx, l3);
            gen_set_label(tcg_ctx, l2);
            tcg_gen_div_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0, t1);
            gen_set_label(tcg_ctx, l3);
        }
        break;
    case OPC_DDIVU_G_2E:
    case OPC_DDIVU_G_2F:
        {
            TCGLabel *l1 = gen_new_label(tcg_ctx);
            TCGLabel *l2 = gen_new_label(tcg_ctx);
            tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_NE, t1, 0, l1);
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], 0);
            tcg_gen_br(tcg_ctx, l2);
            gen_set_label(tcg_ctx, l1);
            tcg_gen_divu_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0, t1);
            gen_set_label(tcg_ctx, l2);
        }
        break;
    case OPC_DMOD_G_2E:
    case OPC_DMOD_G_2F:
        {
            TCGLabel *l1 = gen_new_label(tcg_ctx);
            TCGLabel *l2 = gen_new_label(tcg_ctx);
            TCGLabel *l3 = gen_new_label(tcg_ctx);
            tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_EQ, t1, 0, l1);
            tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_NE, t0, -1LL << 63, l2);
            tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_NE, t1, -1LL, l2);
            gen_set_label(tcg_ctx, l1);
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], 0);
            tcg_gen_br(tcg_ctx, l3);
            gen_set_label(tcg_ctx, l2);
            tcg_gen_rem_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0, t1);
            gen_set_label(tcg_ctx, l3);
        }
        break;
    case OPC_DMODU_G_2E:
    case OPC_DMODU_G_2F:
        {
            TCGLabel *l1 = gen_new_label(tcg_ctx);
            TCGLabel *l2 = gen_new_label(tcg_ctx);
            tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_NE, t1, 0, l1);
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], 0);
            tcg_gen_br(tcg_ctx, l2);
            gen_set_label(tcg_ctx, l1);
            tcg_gen_remu_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0, t1);
            gen_set_label(tcg_ctx, l2);
        }
        break;
#endif
    }

    tcg_temp_free(tcg_ctx, t0);
    tcg_temp_free(tcg_ctx, t1);
}